

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

bool __thiscall
CKey::SignSchnorr(CKey *this,uint256 *hash,Span<unsigned_char> sig,uint256 *merkle_root,uint256 *aux
                 )

{
  bool bVar1;
  pointer *__ptr;
  long in_FS_OFFSET;
  KeyPair kp;
  KeyPair local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  KeyPair::KeyPair(&local_38,this,merkle_root);
  bVar1 = KeyPair::SignSchnorr(&local_38,hash,sig,aux);
  if (local_38.m_keypair._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>,_true,_true>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_96UL>_> *)&local_38,
               (array<unsigned_char,_96UL> *)
               local_38.m_keypair._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CKey::SignSchnorr(const uint256& hash, Span<unsigned char> sig, const uint256* merkle_root, const uint256& aux) const
{
    KeyPair kp = ComputeKeyPair(merkle_root);
    return kp.SignSchnorr(hash, sig, aux);
}